

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_>::~WienerDenoiseTest
          (WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  undefined8 *in_RDI;
  undefined8 *local_48;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_30;
  undefined8 *local_10;
  
  *in_RDI = &PTR__WienerDenoiseTest_01f55e98;
  local_10 = in_RDI + 0x1d;
  do {
    local_10 = local_10 + -3;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffc0);
  } while (local_10 != in_RDI + 0x14);
  local_30 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x14);
  do {
    local_30 = local_30 + -1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_30);
  } while (local_30 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb));
  local_48 = in_RDI + 0xb;
  do {
    local_48 = local_48 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_30);
  } while (local_48 != in_RDI + 2);
  testing::Test::~Test((Test *)0x5f2ca0);
  return;
}

Assistant:

static void SetUpTestSuite() { aom_dsp_rtcd(); }